

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O0

Vec_Str_t * Io_WriteEncodeLiterals(Vec_Int_t *vLits)

{
  int iVar1;
  Vec_Str_t *p;
  uchar *puVar2;
  int local_38;
  int local_2c;
  int i;
  int Diff;
  int LitPrev;
  int Lit;
  int Pos;
  Vec_Str_t *vBinary;
  Vec_Int_t *vLits_local;
  
  iVar1 = Vec_IntSize(vLits);
  p = Vec_StrAlloc(iVar1 << 1);
  i = Vec_IntEntry(vLits,0);
  puVar2 = (uchar *)Vec_StrArray(p);
  LitPrev = Io_WriteAigerEncode(puVar2,0,i);
  for (local_2c = 1; iVar1 = Vec_IntSize(vLits), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vLits,local_2c);
    local_38 = iVar1 - i;
    if (iVar1 < i) {
      local_38 = -local_38;
    }
    puVar2 = (uchar *)Vec_StrArray(p);
    LitPrev = Io_WriteAigerEncode(puVar2,LitPrev,local_38 << 1 | (uint)(iVar1 < i));
    if (p->nCap < LitPrev + 10) {
      Vec_StrGrow(p,p->nCap + 1);
    }
    i = iVar1;
  }
  p->nSize = LitPrev;
  return p;
}

Assistant:

Vec_Str_t * Io_WriteEncodeLiterals( Vec_Int_t * vLits )
{
    Vec_Str_t * vBinary;
    int Pos = 0, Lit, LitPrev, Diff, i;
    vBinary = Vec_StrAlloc( 2 * Vec_IntSize(vLits) );
    LitPrev = Vec_IntEntry( vLits, 0 );
    Pos = Io_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, LitPrev ); 
    Vec_IntForEachEntryStart( vLits, Lit, i, 1 )
    {
        Diff = Lit - LitPrev;
        Diff = (Lit < LitPrev)? -Diff : Diff;
        Diff = (Diff << 1) | (int)(Lit < LitPrev);
        Pos = Io_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, Diff );
        LitPrev = Lit;
        if ( Pos + 10 > vBinary->nCap )
            Vec_StrGrow( vBinary, vBinary->nCap+1 );
    }
    vBinary->nSize = Pos;
/*
    // verify
    {
        extern Vec_Int_t * Io_WriteDecodeLiterals( char ** ppPos, int nEntries );
        char * pPos = Vec_StrArray( vBinary );
        Vec_Int_t * vTemp = Io_WriteDecodeLiterals( &pPos, Vec_IntSize(vLits) );
        for ( i = 0; i < Vec_IntSize(vLits); i++ )
        {
            int Entry1 = Vec_IntEntry(vLits,i);
            int Entry2 = Vec_IntEntry(vTemp,i);
            assert( Entry1 == Entry2 );
        }
    }
*/
    return vBinary;
}